

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgGridLocalPolynomial.hpp
# Opt level: O1

Data2D<double> * __thiscall
TasGrid::GridLocalPolynomial::encodeSupportForGPU<1,(TasGrid::TypeOneDRule)37,double>
          (Data2D<double> *__return_storage_ptr__,GridLocalPolynomial *this,MultiIndexSet *work)

{
  pointer piVar1;
  size_t sVar2;
  pointer pdVar3;
  size_t sVar4;
  long lVar5;
  long lVar6;
  uint uVar7;
  int iVar8;
  double dVar9;
  allocator_type local_19;
  
  sVar4 = (size_t)(this->super_BaseCanonicalGrid).num_dimensions;
  iVar8 = work->cache_num_indexes;
  __return_storage_ptr__->stride = sVar4;
  __return_storage_ptr__->num_strips = (long)iVar8;
  ::std::vector<double,_std::allocator<double>_>::vector
            (&__return_storage_ptr__->vec,(long)iVar8 * sVar4,&local_19);
  if (0 < work->cache_num_indexes) {
    lVar5 = 0;
    do {
      if (0 < (this->super_BaseCanonicalGrid).num_dimensions) {
        sVar4 = work->num_dimensions;
        piVar1 = (work->indexes).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        sVar2 = __return_storage_ptr__->stride;
        pdVar3 = (__return_storage_ptr__->vec).super__Vector_base<double,_std::allocator<double>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        lVar6 = 0;
        do {
          uVar7 = piVar1[sVar4 * lVar5 + lVar6];
          dVar9 = -1.0;
          if (uVar7 != 0) {
            dVar9 = 1.0;
            if (2 < uVar7) {
              uVar7 = uVar7 - 1;
              iVar8 = 1;
              do {
                uVar7 = (int)uVar7 >> 1;
                iVar8 = iVar8 * 2;
              } while (1 < uVar7);
              dVar9 = (double)iVar8;
            }
            dVar9 = 1.0 / dVar9;
          }
          pdVar3[sVar2 * lVar5 + lVar6] = dVar9;
          lVar6 = lVar6 + 1;
        } while (lVar6 < (this->super_BaseCanonicalGrid).num_dimensions);
      }
      lVar5 = lVar5 + 1;
    } while (lVar5 < work->cache_num_indexes);
  }
  return __return_storage_ptr__;
}

Assistant:

Data2D<T> encodeSupportForGPU(const MultiIndexSet &work) const{
        Data2D<T> cpu_support(num_dimensions, work.getNumIndexes());
        for(int i=0; i<work.getNumIndexes(); i++){
            const int* p = work.getIndex(i);
            T *s = cpu_support.getStrip(i);
            for(int j=0; j<num_dimensions; j++){
                if (ord == 0){
                    s[j] = static_cast<T>(RuleLocal::getSupport<RuleLocal::erule::pwc>(p[j]));
                } else {
                    switch(crule) {
                        case rule_localp:
                            s[j] = static_cast<T>(RuleLocal::getSupport<RuleLocal::erule::localp>(p[j]));
                            break;
                        case rule_semilocalp:
                            s[j] = static_cast<T>(RuleLocal::getSupport<RuleLocal::erule::semilocalp>(p[j]));
                            break;
                        case rule_localp0:
                            s[j] = static_cast<T>(RuleLocal::getSupport<RuleLocal::erule::localp0>(p[j]));
                            break;
                        case rule_localpb:
                            s[j] = static_cast<T>(RuleLocal::getSupport<RuleLocal::erule::localpb>(p[j]));
                            break;
                    };
                    if (ord == 2) s[j] *= s[j];
                    if ((crule == rule_localp) || (crule == rule_semilocalp)) if (p[j] == 0) s[j] = static_cast<T>(-1.0); // constant function
                    if ((crule == rule_localp) && (ord == 2)){
                        if (p[j] == 1) s[j] = static_cast<T>(-2.0);
                        else if (p[j] == 2) s[j] = static_cast<T>(-3.0);
                    }
                    if ((crule == rule_semilocalp) && (ord == 2)){
                        if (p[j] == 1) s[j] = static_cast<T>(-4.0);
                        else if (p[j] == 2) s[j] = static_cast<T>(-5.0);
                    }
                    if ((crule == rule_localpb) && (ord == 2)){
                        if (p[j] < 2) s[j] = static_cast<T>(-2.0); // linear functions on level 0
                    }
                }
            }
        }
        return cpu_support;
    }